

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,string_view field,double val)

{
  ValueFederate *pVVar1;
  bool bVar2;
  char *in_R8;
  string_view str;
  NamedPoint np;
  data_view local_b0;
  SmallBuffer local_90;
  
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    NamedPoint::NamedPoint((NamedPoint *)&local_90,field,val);
    bVar2 = changeDetected(&this->prevValue,(NamedPoint *)&local_90,this->delta);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&local_90);
      return;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,(NamedPoint *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    str._M_str = in_R8;
    str._M_len = (size_t)field._M_str;
    typeConvert(&local_90,(helics *)(ulong)(uint)this->pubType,(DataType)field._M_len,str,val);
    local_b0.dblock._M_len = local_90.bufferSize;
    local_b0.dblock._M_str = (char *)local_90.heap;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&local_90);
  }
  return;
}

Assistant:

void Publication::publish(std::string_view field, double val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        NamedPoint np(field, val);
        if (changeDetected(prevValue, np, delta)) {
            prevValue = std::move(np);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, field, val);
        fed->publishBytes(*this, db);
    }
}